

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

int luv_fs_read(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  size_t __size;
  lua_Integer off;
  char *pcVar4;
  uv_fs_t *req;
  luv_req_t *plVar5;
  uv_loop_t *loop;
  char *pcVar6;
  char *pcVar7;
  code *cb;
  uv_buf_t local_40;
  
  lVar3 = luaL_checkinteger(L,1);
  __size = luaL_checkinteger(L,2);
  off = luaL_checkinteger(L,3);
  pcVar4 = (char *)malloc(__size);
  if (pcVar4 != (char *)0x0) {
    local_40 = uv_buf_init(pcVar4,(uint)__size);
    pcVar4 = local_40.base;
    iVar1 = luv_check_continuation(L,4);
    req = (uv_fs_t *)lua_newuserdata(L,0x1b8);
    plVar5 = luv_setup_req(L,iVar1);
    req->data = plVar5;
    plVar5->data = pcVar4;
    iVar1 = plVar5->callback_ref;
    loop = luv_loop(L);
    cb = (uv_fs_cb)0x0;
    if (iVar1 != -2) {
      cb = luv_fs_cb;
    }
    iVar2 = uv_fs_read(loop,req,(uv_file)lVar3,&local_40,1,off,cb);
    if ((req->fs_type == UV_FS_ACCESS) || (-1 < iVar2)) {
      if (iVar1 == -2) {
        iVar1 = push_fs_result(L,req);
        if (req->fs_type != UV_FS_SCANDIR) {
          luv_cleanup_req(L,(luv_req_t *)req->data);
          req->data = (void *)0x0;
          uv_fs_req_cleanup(req);
        }
      }
      else {
        lua_rawgeti(L,-0xf4628,(long)plVar5->req_ref);
        iVar1 = 1;
      }
    }
    else {
      lua_pushnil(L);
      pcVar4 = req->path;
      pcVar6 = uv_err_name((int)req->result);
      pcVar7 = uv_strerror((int)req->result);
      if (pcVar4 == (char *)0x0) {
        lua_pushfstring(L,"%s: %s",pcVar6,pcVar7);
      }
      else {
        lua_pushfstring(L,"%s: %s: %s",pcVar6,pcVar7,req->path);
      }
      pcVar4 = uv_err_name((int)req->result);
      lua_pushstring(L,pcVar4);
      luv_cleanup_req(L,(luv_req_t *)req->data);
      req->data = (void *)0x0;
      uv_fs_req_cleanup(req);
      iVar1 = 3;
    }
    return iVar1;
  }
  iVar1 = luaL_error(L,"Failure to allocate buffer");
  return iVar1;
}

Assistant:

static int luv_fs_read(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  uv_file file = luaL_checkinteger(L, 1);
  int64_t len = luaL_checkinteger(L, 2);
  int64_t offset = luaL_checkinteger(L, 3);
  uv_buf_t buf;
  int ref;
  uv_fs_t* req;
  char* data = (char*)malloc(len);
  if (!data) return luaL_error(L, "Failure to allocate buffer");
  buf = uv_buf_init(data, len);
  ref = luv_check_continuation(L, 4);
  req = (uv_fs_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);
  // TODO: find out why we can't just use req->ptr for the base
  ((luv_req_t*)req->data)->data = buf.base;
  FS_CALL(read, req, file, &buf, 1, offset);
}